

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1dc1a36::av1_inv_txfm1d_round_trip_Test::TestBody
          (av1_inv_txfm1d_round_trip_Test *this)

{
  internal iVar1;
  undefined8 *puVar2;
  byte bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  SEARCH_METHODS *pSVar11;
  int iVar12;
  bool bVar13;
  int txfm_size;
  AssertionResult gtest_ar;
  int node_err;
  int max_error;
  ACMRandom rnd;
  int32_t input [64];
  int32_t round_trip_output [64];
  int32_t output [64];
  Message local_3a0;
  uint local_394;
  internal local_390 [8];
  undefined8 *local_388;
  long local_380;
  long local_378;
  int local_370 [2];
  AssertHelper local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  code *local_350;
  code *local_348;
  Random local_33c;
  int local_338 [64];
  int local_238 [64];
  undefined1 local_138 [264];
  
  local_33c.state_ = 0xbaba;
  local_380 = 0;
  do {
    local_394 = *(uint *)((anonymous_namespace)::txfm_size_ls + local_380 * 4);
    local_360 = (anonymous_namespace)::fwd_txfm_func_ls + local_380 * 0x10;
    local_358 = (anonymous_namespace)::inv_txfm_func_ls + local_380 * 0x10;
    local_378 = 0;
    do {
      local_348 = *(code **)(local_360 + local_378 * 8);
      local_350 = *(code **)(local_358 + local_378 * 8);
      local_370[1] = 2;
      if (local_348 == (code *)0x0) {
        iVar12 = 7;
      }
      else {
        iVar12 = 0;
        do {
          local_3a0.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_4_ = 0x40;
          testing::internal::CmpHelperLE<int,int>
                    (local_390,"txfm_size","(int)(sizeof(input) / sizeof(input[0]))",
                     (int *)&local_394,(int *)&local_3a0);
          puVar2 = local_388;
          iVar1 = local_390[0];
          if (local_390[0] == (internal)0x0) {
            testing::Message::Message(&local_3a0);
            pSVar11 = "";
            if (local_388 != (undefined8 *)0x0) {
              pSVar11 = (SEARCH_METHODS *)*local_388;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_368,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_inv_txfm1d_test.cc"
                       ,0x89,(char *)pSVar11);
            testing::internal::AssertHelper::operator=(&local_368,&local_3a0);
            testing::internal::AssertHelper::~AssertHelper(&local_368);
            if ((long *)CONCAT44(local_3a0.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._4_4_,
                                 local_3a0.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_3a0.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._4_4_,
                                             local_3a0.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._0_4_) + 8))();
            }
            puVar2 = local_388;
            if (local_388 != (undefined8 *)0x0) {
              if ((undefined8 *)*local_388 != local_388 + 2) {
                operator_delete((undefined8 *)*local_388);
              }
              operator_delete(puVar2);
            }
LAB_006ef37e:
            iVar12 = 1;
            goto LAB_006ef388;
          }
          if (local_388 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_388 != local_388 + 2) {
              operator_delete((undefined8 *)*local_388);
            }
            operator_delete(puVar2);
          }
          if (0 < (int)local_394) {
            lVar10 = 0;
            do {
              uVar4 = testing::internal::Random::Generate(&local_33c,0x80000000);
              uVar5 = testing::internal::Random::Generate(&local_33c,0x80000000);
              local_338[lVar10] = (uVar4 >> 0xf & 0x3ff) - (uVar5 >> 0xf & 0x3ff);
              lVar10 = lVar10 + 1;
            } while (lVar10 < (int)local_394);
          }
          (*local_348)(local_338,local_138,0xd,(anonymous_namespace)::range_bit);
          (*local_350)(local_138,local_238,0xd,(anonymous_namespace)::range_bit);
          uVar8 = (ulong)local_394;
          if (0 < (int)local_394) {
            lVar10 = 0;
            do {
              bVar3 = 0xfe;
              if ((int)uVar8 != 0) {
                uVar9 = uVar8 & 0xffffffff;
                bVar3 = 0xfe;
                do {
                  uVar9 = (ulong)(uint)((int)uVar9 >> 1);
                  bVar3 = bVar3 + 1;
                  uVar7 = (uint)uVar8;
                  uVar8 = uVar9;
                } while (1 < uVar7);
              }
              iVar6 = local_338[lVar10] -
                      (int)((1L << (bVar3 - 1 & 0x3f)) + (long)local_238[lVar10] >> (bVar3 & 0x3f));
              local_370[0] = -iVar6;
              if (0 < iVar6) {
                local_370[0] = iVar6;
              }
              testing::internal::CmpHelperLE<int,int>
                        (local_390,"node_err","max_error",local_370,local_370 + 1);
              if (local_390[0] == (internal)0x0) {
                testing::Message::Message(&local_3a0);
                pSVar11 = "";
                if (local_388 != (undefined8 *)0x0) {
                  pSVar11 = (SEARCH_METHODS *)*local_388;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_368,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_inv_txfm1d_test.cc"
                           ,0x96,(char *)pSVar11);
                testing::internal::AssertHelper::operator=(&local_368,&local_3a0);
                testing::internal::AssertHelper::~AssertHelper(&local_368);
                if ((long *)CONCAT44(local_3a0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_3a0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_3a0.ss_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl._4_4_,
                                                 local_3a0.ss_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl._0_4_) + 8))();
                }
              }
              puVar2 = local_388;
              if (local_388 != (undefined8 *)0x0) {
                if ((undefined8 *)*local_388 != local_388 + 2) {
                  operator_delete((undefined8 *)*local_388);
                }
                operator_delete(puVar2);
              }
              lVar10 = lVar10 + 1;
              uVar8 = (ulong)(int)local_394;
            } while (lVar10 < (long)uVar8);
          }
          if (iVar1 == (internal)0x0) goto LAB_006ef37e;
          iVar12 = iVar12 + 1;
        } while (iVar12 != 5000);
        iVar12 = 0;
      }
LAB_006ef388:
      if ((iVar12 != 7) && (iVar12 != 0)) goto LAB_006ef3a6;
      bVar13 = local_378 == 0;
      local_378 = local_378 + 1;
    } while (bVar13);
    iVar12 = 5;
LAB_006ef3a6:
    if (((iVar12 != 5) && (iVar12 != 0)) || (local_380 = local_380 + 1, local_380 == 5)) {
      return;
    }
  } while( true );
}

Assistant:

TEST(av1_inv_txfm1d, round_trip) {
  ACMRandom rnd(ACMRandom::DeterministicSeed());
  for (int si = 0; si < NELEMENTS(fwd_txfm_func_ls); ++si) {
    int txfm_size = txfm_size_ls[si];

    for (int ti = 0; ti < txfm_type_num; ++ti) {
      TxfmFunc fwd_txfm_func = fwd_txfm_func_ls[si][ti];
      TxfmFunc inv_txfm_func = inv_txfm_func_ls[si][ti];
      int max_error = 2;

      if (!fwd_txfm_func) continue;

      const int count_test_block = 5000;
      for (int i = 0; i < count_test_block; ++i) {
        int32_t input[64];
        int32_t output[64];
        int32_t round_trip_output[64];

        ASSERT_LE(txfm_size, NELEMENTS(input));

        for (int ni = 0; ni < txfm_size; ++ni) {
          input[ni] = rnd.Rand16() % input_base - rnd.Rand16() % input_base;
        }

        fwd_txfm_func(input, output, cos_bit, range_bit);
        inv_txfm_func(output, round_trip_output, cos_bit, range_bit);

        for (int ni = 0; ni < txfm_size; ++ni) {
          int node_err =
              abs(input[ni] - round_shift(round_trip_output[ni],
                                          get_max_bit(txfm_size) - 1));
          EXPECT_LE(node_err, max_error);
        }
      }
    }
  }
}